

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgMeshEffect.cpp
# Opt level: O2

void __thiscall dgMeshEffect::MergeFaces(dgMeshEffect *this,dgMeshEffect *source)

{
  dgVertexAtribute *pdVar1;
  HaF64 *pHVar2;
  dgVertexAtribute *pdVar3;
  undefined1 auVar4 [16];
  HaF64 HVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  HaF64 HVar9;
  HaF64 HVar10;
  HaF64 HVar11;
  HaF64 HVar12;
  HaF64 HVar13;
  HaF64 HVar14;
  HaF64 HVar15;
  HaF64 HVar16;
  HaF64 HVar17;
  HaF64 HVar18;
  HaF64 HVar19;
  HaI32 HVar20;
  dgVertexAtribute *pdVar21;
  long lVar22;
  dgEdge *pdVar23;
  Iterator local_c048;
  dgVertexAtribute face [512];
  
  HVar20 = dgPolyhedra::IncLRU(&source->super_dgPolyhedra);
  local_c048.m_tree = (dgTree<dgEdge,_long> *)source;
  local_c048.m_ptr =
       &dgTree<dgEdge,_long>::Minimum((dgTree<dgEdge,_long> *)source)->super_dgRedBackNode;
  do {
    if ((dgTreeNode *)local_c048.m_ptr == (dgTreeNode *)0x0) {
      return;
    }
    if ((0 < ((dgEdge *)((long)local_c048.m_ptr + 0x28))->m_incidentFace) &&
       (((dgEdge *)((long)local_c048.m_ptr + 0x28))->m_mark < HVar20)) {
      pdVar3 = source->m_attib;
      lVar22 = 0;
      pdVar21 = face;
      pdVar23 = (dgEdge *)((long)local_c048.m_ptr + 0x28);
      do {
        pdVar23->m_mark = HVar20;
        pdVar1 = pdVar3 + pdVar23->m_userData;
        HVar5 = (HaF64)(pdVar1->m_vertex).super_dgTemplateVector<double>.m_x;
        dVar6 = (pdVar1->m_vertex).super_dgTemplateVector<double>.m_y;
        dVar7 = (pdVar1->m_vertex).super_dgTemplateVector<double>.m_z;
        dVar8 = (pdVar1->m_vertex).super_dgTemplateVector<double>.m_w;
        HVar9 = pdVar1->m_normal_x;
        HVar10 = pdVar1->m_normal_y;
        HVar11 = pdVar1->m_normal_z;
        HVar12 = pdVar1->m_u0;
        pHVar2 = &pdVar3[pdVar23->m_userData].m_normal_x;
        HVar13 = pHVar2[1];
        HVar14 = pHVar2[2];
        HVar15 = pHVar2[3];
        HVar16 = pHVar2[4];
        HVar17 = pHVar2[5];
        HVar18 = pHVar2[6];
        HVar19 = pHVar2[7];
        pdVar21->m_normal_x = *pHVar2;
        pdVar21->m_normal_y = HVar13;
        pdVar21->m_normal_z = HVar14;
        pdVar21->m_u0 = HVar15;
        pdVar21->m_v0 = HVar16;
        pdVar21->m_u1 = HVar17;
        pdVar21->m_v1 = HVar18;
        pdVar21->m_material = HVar19;
        (pdVar21->m_vertex).super_dgTemplateVector<double>.m_x = (double)HVar5;
        (pdVar21->m_vertex).super_dgTemplateVector<double>.m_y = dVar6;
        (pdVar21->m_vertex).super_dgTemplateVector<double>.m_z = dVar7;
        (pdVar21->m_vertex).super_dgTemplateVector<double>.m_w = dVar8;
        pdVar21->m_normal_x = HVar9;
        pdVar21->m_normal_y = HVar10;
        pdVar21->m_normal_z = HVar11;
        pdVar21->m_u0 = HVar12;
        if (lVar22 == 0x1ff) {
          __assert_fail("count < hacd::HaI32 (sizeof (face) / sizeof (face[0]))",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgMeshEffect.cpp"
                        ,0x893,"void dgMeshEffect::MergeFaces(const dgMeshEffect *const)");
        }
        pdVar23 = pdVar23->m_next;
        lVar22 = lVar22 + 1;
        pdVar21 = pdVar21 + 1;
      } while (pdVar23 != (dgEdge *)((long)local_c048.m_ptr + 0x28));
      auVar4 = vcvtdq2pd_avx(ZEXT416((uint)(int)(double)face[0].m_material));
      AddPolygon(this,(HaI32)lVar22,(HaF64 *)face,0x60,
                 (int)(double)face[0].m_material - (uint)((double)face[0].m_material < auVar4._0_8_)
                );
    }
    dgTree<dgEdge,_long>::Iterator::operator++(&local_c048,0);
  } while( true );
}

Assistant:

void dgMeshEffect::MergeFaces (const dgMeshEffect* const source)
{
	hacd::HaI32 mark = source->IncLRU();
	dgPolyhedra::Iterator iter (*source);
	for(iter.Begin(); iter; iter ++){
		dgEdge* const edge = &(*iter);
		if ((edge->m_incidentFace > 0) && (edge->m_mark < mark)) {
			dgVertexAtribute face[DG_MESH_EFFECT_POINT_SPLITED];

			hacd::HaI32 count = 0;
			dgEdge* ptr = edge;
			do {
				ptr->m_mark = mark;
				face[count] = source->m_attib[ptr->m_userData];
				count ++;
				HACD_ASSERT (count < hacd::HaI32 (sizeof (face) / sizeof (face[0])));
				ptr = ptr->m_next;
			} while (ptr != edge);
			AddPolygon(count, &face[0].m_vertex.m_x, sizeof (dgVertexAtribute), dgFastInt (face[0].m_material));
		}
	}
}